

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  uint uVar1;
  TransformerLogLog *pTVar2;
  ImDrawVert *pIVar3;
  uint *puVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImPlotPoint IVar7;
  float local_58;
  float fStack_54;
  ImPlotPoint local_40;
  
  pTVar2 = this->Transformer;
  IVar7 = GetterXsYs<double>::operator()(this->Getter,prim * 2);
  local_40.y = IVar7.y;
  local_40.x = IVar7.x;
  IVar5 = TransformerLogLog::operator()(pTVar2,&local_40);
  pTVar2 = this->Transformer;
  IVar7 = GetterXsYs<double>::operator()(this->Getter,prim * 2 + 1);
  local_40.y = IVar7.y;
  local_40.x = IVar7.x;
  IVar6 = TransformerLogLog::operator()(pTVar2,&local_40);
  pIVar3 = DrawList->_VtxWritePtr;
  local_58 = IVar5.x;
  fStack_54 = IVar5.y;
  (pIVar3->pos).x = local_58;
  (pIVar3->pos).y = fStack_54;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar3 = DrawList->_VtxWritePtr;
  pIVar3->col = this->Col;
  pIVar3[1].pos.x = local_58;
  pIVar3[1].pos.y = IVar6.y;
  pIVar3[1].uv = *uv;
  pIVar3 = DrawList->_VtxWritePtr;
  pIVar3[1].col = this->Col;
  pIVar3[2].pos = IVar6;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar3 = DrawList->_VtxWritePtr;
  pIVar3[2].col = this->Col;
  pIVar3[3].pos.x = IVar6.x;
  pIVar3[3].pos.y = fStack_54;
  pIVar3[3].uv = *uv;
  pIVar3 = DrawList->_VtxWritePtr;
  pIVar3[3].col = this->Col;
  DrawList->_VtxWritePtr = pIVar3 + 4;
  uVar1 = DrawList->_VtxCurrentIdx;
  puVar4 = DrawList->_IdxWritePtr;
  *puVar4 = uVar1;
  puVar4[1] = uVar1 + 1;
  puVar4[2] = DrawList->_VtxCurrentIdx + 3;
  puVar4[3] = DrawList->_VtxCurrentIdx + 1;
  puVar4[4] = DrawList->_VtxCurrentIdx + 2;
  puVar4[5] = DrawList->_VtxCurrentIdx + 3;
  DrawList->_IdxWritePtr = puVar4 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P1 = Transformer(Getter(2*prim));
        ImVec2 P2 = Transformer(Getter(2*prim+1));
        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = Col;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = Col;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = Col;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = Col;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }